

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMatrixUtils.cpp
# Opt level: O0

HighsStatus
assessMatrix(HighsLogOptions *log_options,string *matrix_name,HighsInt vec_dim,HighsInt num_vec,
            vector<int,_std::allocator<int>_> *matrix_start,
            vector<int,_std::allocator<int>_> *matrix_p_end,
            vector<int,_std::allocator<int>_> *matrix_index,
            vector<double,_std::allocator<double>_> *matrix_value,double small_matrix_value,
            double large_matrix_value)

{
  HighsStatus HVar1;
  string *in_RSI;
  bool partitioned;
  double in_stack_000000b8;
  double in_stack_000000c0;
  vector<int,_std::allocator<int>_> *in_stack_000000c8;
  bool in_stack_000000d7;
  HighsInt in_stack_000000d8;
  HighsInt in_stack_000000dc;
  string *in_stack_000000e0;
  HighsLogOptions *in_stack_000000e8;
  vector<int,_std::allocator<int>_> *in_stack_00000100;
  vector<int,_std::allocator<int>_> *in_stack_00000108;
  vector<double,_std::allocator<double>_> *in_stack_00000110;
  string local_60 [39];
  undefined1 local_39;
  
  local_39 = 0;
  std::__cxx11::string::string(local_60,in_RSI);
  HVar1 = assessMatrix(in_stack_000000e8,in_stack_000000e0,in_stack_000000dc,in_stack_000000d8,
                       in_stack_000000d7,in_stack_000000c8,in_stack_00000100,in_stack_00000108,
                       in_stack_00000110,in_stack_000000c0,in_stack_000000b8);
  std::__cxx11::string::~string(local_60);
  return HVar1;
}

Assistant:

HighsStatus assessMatrix(const HighsLogOptions& log_options,
                         const std::string matrix_name, const HighsInt vec_dim,
                         const HighsInt num_vec, vector<HighsInt>& matrix_start,
                         vector<HighsInt>& matrix_p_end,
                         vector<HighsInt>& matrix_index,
                         vector<double>& matrix_value,
                         const double small_matrix_value,
                         const double large_matrix_value) {
  const bool partitioned = false;
  return assessMatrix(log_options, matrix_name, vec_dim, num_vec, partitioned,
                      matrix_start, matrix_p_end, matrix_index, matrix_value,
                      small_matrix_value, large_matrix_value);
}